

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::get_mutable_buffer
               (char_t **out_buffer,size_t *out_length,void *contents,size_t size,bool is_mutable)

{
  void *__dest;
  size_t in_RCX;
  void *in_RDX;
  size_t *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  char_t *buffer;
  size_t length;
  
  if ((in_R8B & 1) == 0) {
    __dest = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                               allocate)(in_RCX + 1);
    if (__dest == (void *)0x0) {
      return false;
    }
    if (in_RDX != (void *)0x0) {
      memcpy(__dest,in_RDX,in_RCX);
    }
    *(undefined1 *)((long)__dest + in_RCX) = 0;
    *in_RDI = __dest;
    *in_RSI = in_RCX + 1;
  }
  else {
    *in_RDI = in_RDX;
    *in_RSI = in_RCX;
  }
  return true;
}

Assistant:

PUGI_IMPL_FN bool get_mutable_buffer(char_t*& out_buffer, size_t& out_length, const void* contents, size_t size, bool is_mutable)
	{
		size_t length = size / sizeof(char_t);

		if (is_mutable)
		{
			out_buffer = static_cast<char_t*>(const_cast<void*>(contents));
			out_length = length;
		}
		else
		{
			char_t* buffer = static_cast<char_t*>(xml_memory::allocate((length + 1) * sizeof(char_t)));
			if (!buffer) return false;

			if (contents)
				memcpy(buffer, contents, length * sizeof(char_t));
			else
				assert(length == 0);

			buffer[length] = 0;

			out_buffer = buffer;
			out_length = length + 1;
		}

		return true;
	}